

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

char * getenv(char *__name)

{
  bool bVar1;
  stCoSysEnvArr_t *psVar2;
  void *pvVar3;
  char *pcVar4;
  stCoSysEnv_t *e;
  stCoSysEnvArr_t *arr;
  stCoSysEnv_t name;
  stCoRoutine_t *self;
  char *n_local;
  
  if (g_sys_getenv_func == (getenv_pfn_t)0x0) {
    g_sys_getenv_func = (getenv_pfn_t)dlsym(0xffffffffffffffff,"getenv");
  }
  bVar1 = co_is_enable_sys_hook();
  if ((bVar1) && (g_co_sysenv.data != (stCoSysEnv_t *)0x0)) {
    name.value = (char *)co_self();
    name.name = (char *)0x0;
    arr = (stCoSysEnvArr_t *)__name;
    if (((stCoRoutine_t *)name.value)->pvEnv == (void *)0x0) {
      psVar2 = dup_co_sysenv_arr(&g_co_sysenv);
      *(stCoSysEnvArr_t **)(name.value + 0xa0) = psVar2;
    }
    pvVar3 = bsearch(&arr,(void *)**(undefined8 **)(name.value + 0xa0),
                     (*(undefined8 **)(name.value + 0xa0))[1],0x10,co_sysenv_comp);
    if (pvVar3 != (void *)0x0) {
      return *(char **)((long)pvVar3 + 8);
    }
  }
  pcVar4 = (*g_sys_getenv_func)(__name);
  return pcVar4;
}

Assistant:

char *getenv( const char *n )
{
	HOOK_SYS_FUNC( getenv )
	if( co_is_enable_sys_hook() && g_co_sysenv.data )
	{
		stCoRoutine_t *self = co_self();

		stCoSysEnv_t name = { (char*)n,0 };

		if( !self->pvEnv )
		{
			self->pvEnv = dup_co_sysenv_arr( &g_co_sysenv );
		}
		stCoSysEnvArr_t *arr = (stCoSysEnvArr_t*)(self->pvEnv);

		stCoSysEnv_t *e = (stCoSysEnv_t*)bsearch( &name,arr->data,arr->cnt,sizeof(name),co_sysenv_comp );

		if( e )
		{
			return e->value;
		}

	}
	return g_sys_getenv_func( n );

}